

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform_data.h
# Opt level: O0

void __thiscall
draco::AttributeTransformData::AppendParameterValue<float>
          (AttributeTransformData *this,float *in_data)

{
  float *in_RSI;
  undefined8 in_RDI;
  int byte_offset;
  AttributeTransformData *unaff_retaddr;
  
  byte_offset = (int)((ulong)in_RDI >> 0x20);
  DataBuffer::data_size((DataBuffer *)0x20e7d0);
  SetParameterValue<float>(unaff_retaddr,byte_offset,in_RSI);
  return;
}

Assistant:

void AppendParameterValue(const DataTypeT &in_data) {
    SetParameterValue(static_cast<int>(buffer_.data_size()), in_data);
  }